

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

string * __thiscall
leveldb::NumberToString_abi_cxx11_(string *__return_storage_ptr__,leveldb *this,uint64_t num)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  AppendNumberTo(__return_storage_ptr__,(uint64_t)this);
  return __return_storage_ptr__;
}

Assistant:

std::string NumberToString(uint64_t num) {
  std::string r;
  AppendNumberTo(&r, num);
  return r;
}